

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::setWindowTitle_sys(QWidgetPrivate *this,QString *caption)

{
  QObject *pQVar1;
  long lVar2;
  QString *pQVar3;
  QArrayData *pQVar4;
  storage_type_conflict *psVar5;
  QObject *pQVar6;
  char cVar7;
  byte bVar8;
  long *plVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QArrayData *local_58;
  storage_type_conflict *local_50;
  QObject *pQStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if (((((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xc) & 1) == 0) ||
       (*(long *)(*(long *)(pQVar1 + 8) + 0x78) == 0)) ||
      (lVar2 = *(long *)(*(long *)(*(long *)(pQVar1 + 8) + 0x78) + 8), lVar2 == 0)) ||
     (pQVar3 = *(QString **)(lVar2 + 0x20), pQVar3 == (QString *)0x0)) {
LAB_003040af:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    cVar7 = QAccessible::isActive();
    if (cVar7 != '\0') {
      plVar9 = (long *)QAccessible::queryAccessibleInterface(pQVar1);
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 0x60))(&local_58,plVar9,0);
        pQVar6 = pQStack_48;
        psVar5 = local_50;
        pQVar4 = local_58;
        QWindow::setTitle(pQVar3);
        (**(code **)(*plVar9 + 0x60))(&local_58,plVar9,0);
        bVar8 = 1;
        if (pQStack_48 == pQVar6) {
          QVar10.m_data = psVar5;
          QVar10.m_size = (qsizetype)pQVar6;
          QVar11.m_data = local_50;
          QVar11.m_size = (qsizetype)pQVar6;
          bVar8 = QtPrivate::equalStrings(QVar11,QVar10);
          bVar8 = bVar8 ^ 1;
        }
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,2,0x10);
          }
        }
        if (bVar8 != 0) {
          local_58 = (QArrayData *)QFont::strikeOut;
          local_50 = (storage_type_conflict *)0xaaaaaaaa0000800c;
          local_40 = 0xaaaaaaaaffffffff;
          pQStack_48 = pQVar1;
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
          QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
        }
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        goto LAB_003040af;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWindow::setTitle(pQVar3);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowTitle_sys(const QString &caption)
{
    Q_Q(QWidget);
    if (!q->isWindow())
        return;

    if (QWindow *window = q->windowHandle())
    {
#if QT_CONFIG(accessibility)
        QString oldAccessibleName;
        const QAccessibleInterface *accessible = QAccessible::isActive()
                                               ? QAccessible::queryAccessibleInterface(q)
                                               : nullptr;
        if (accessible)
            oldAccessibleName = accessible->text(QAccessible::Name);
#endif

        window->setTitle(caption);

#if QT_CONFIG(accessibility)
        if (accessible && accessible->text(QAccessible::Name) != oldAccessibleName) {
            QAccessibleEvent event(q, QAccessible::NameChanged);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }
}